

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[256]> * __thiscall
fmt::v10::make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char[256]>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[256]>
           *__return_storage_ptr__,v10 *this,char (*args) [256])

{
  char (*args_local) [256];
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}